

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O1

void xercesc_4_0::XMLBigDecimal::parseDecimal
               (XMLCh *toParse,XMLCh *retBuffer,int *sign,int *totalDigits,int *fractDigits,
               MemoryManager *manager)

{
  XMLCh *pXVar1;
  short *psVar2;
  ushort uVar3;
  XMLCh XVar4;
  long lVar5;
  NumberFormatException *this;
  bool bVar6;
  long lVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  *retBuffer = L'\0';
  *totalDigits = 0;
  *fractDigits = 0;
  lVar11 = -2;
  do {
    lVar10 = lVar11;
    uVar3 = *(ushort *)((long)toParse + lVar10 + 2);
    lVar11 = lVar10 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar3] < '\0');
  if (uVar3 == 0) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0xdd,XMLNUM_WSString,manager);
LAB_00250fda:
    __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  lVar7 = 0;
  if (toParse != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)toParse + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar2 != 0);
    lVar7 = (lVar7 >> 1) + -1;
  }
  lVar5 = -2 - (long)(toParse + lVar7);
  pXVar8 = toParse + lVar7 + 1;
  lVar7 = lVar11 + lVar7 * -2;
  do {
    pXVar9 = pXVar8 + -2;
    lVar5 = lVar5 + 2;
    pXVar8 = pXVar8 + -1;
    lVar7 = lVar7 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar9] < '\0');
  *sign = 1;
  if (uVar3 == 0x2b) {
    if (lVar7 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0xf5,XMLNUM_Inv_chars,manager);
      goto LAB_00250fda;
    }
  }
  else {
    if (uVar3 != 0x2d) goto LAB_00250f00;
    *sign = -1;
    if (lVar7 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0xed,XMLNUM_Inv_chars,manager);
      goto LAB_00250fda;
    }
  }
  lVar11 = lVar10 + 4;
LAB_00250f00:
  pXVar9 = (XMLCh *)((long)toParse + lVar11 + -2);
  do {
    pXVar1 = pXVar9 + 1;
    pXVar9 = pXVar9 + 1;
  } while (*pXVar1 == L'0');
  if (pXVar9 < pXVar8) {
    bVar6 = false;
    do {
      uVar12 = -(long)pXVar9 - lVar5;
      while (XVar4 = *pXVar9, XVar4 == L'.') {
        if (bVar6) {
          this = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                     ,0x115,XMLNUM_2ManyDecPoint,manager);
          goto LAB_00250fda;
        }
        *fractDigits = (int)(uVar12 >> 1) + -1;
        pXVar9 = pXVar9 + 1;
        uVar12 = uVar12 - 2;
        bVar6 = true;
        if (pXVar8 <= pXVar9) goto LAB_00250f88;
      }
      if ((ushort)(XVar4 + L'ￆ') < 0xfff6) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0x11a,XMLNUM_Inv_chars,manager);
        goto LAB_00250fda;
      }
      pXVar9 = pXVar9 + 1;
      *retBuffer = XVar4;
      retBuffer = retBuffer + 1;
      *totalDigits = *totalDigits + 1;
    } while (pXVar9 < pXVar8);
LAB_00250f88:
    for (; (0 < *fractDigits && (retBuffer[-1] == L'0')); retBuffer = retBuffer + -1) {
      *fractDigits = *fractDigits + -1;
      *totalDigits = *totalDigits + -1;
    }
    if (*totalDigits == 0) {
      *sign = 0;
    }
    *retBuffer = L'\0';
  }
  else {
    *sign = 0;
  }
  return;
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh* const toParse
                               ,        XMLCh* const retBuffer
                               ,        int&         sign
                               ,        int&         totalDigits
                               ,        int&         fractDigits
                               ,        MemoryManager* const manager)
{
    //init
    retBuffer[0] = chNull;
    totalDigits = 0;
    fractDigits = 0;

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string
    sign = 1;
    if (*startPtr == chDash)
    {
        sign = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;         
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        sign = 0;
        return;
    }

    XMLCh* retPtr = (XMLCh*) retBuffer;

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                fractDigits = (int)(endPtr - startPtr - 1);
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr++ = *startPtr++;
        totalDigits++;
    }

    /***
    E2-44 totalDigits

     ... by restricting it to numbers that are expressible as i x 10^-n
     where i and n are integers such that |i| < 10^totalDigits and 0 <= n <= totalDigits. 

        normalization: remove all trailing zero after the '.'
                       and adjust the scaleValue as well.
    ***/
    while ((fractDigits > 0) && (*(retPtr-1) == chDigit_0))          
    {
        retPtr--;
        fractDigits--;
        totalDigits--;
    }
    // 0.0 got past the check for zero because of the decimal point, so we need to double check it here
    if(totalDigits==0)
        sign = 0;

    *retPtr = chNull;   //terminated
    return;
}